

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

void fe_mel_cep(fe_t *fe,mfcc_t *mfcep)

{
  powspec_t *mflogspec;
  double dVar1;
  powspec_t *mfspec;
  int32 i;
  mfcc_t *mfcep_local;
  fe_t *fe_local;
  
  mflogspec = fe->mfspec;
  for (mfspec._4_4_ = 0; mfspec._4_4_ < fe->mel_fb->num_filters; mfspec._4_4_ = mfspec._4_4_ + 1) {
    dVar1 = log((double)mflogspec[mfspec._4_4_] + 0.0001);
    mflogspec[mfspec._4_4_] = (powspec_t)dVar1;
  }
  if (fe->log_spec == '\x01') {
    for (mfspec._4_4_ = 0; mfspec._4_4_ < (int)(uint)fe->feature_dimension;
        mfspec._4_4_ = mfspec._4_4_ + 1) {
      mfcep[mfspec._4_4_] = (mfcc_t)(float)(double)mflogspec[mfspec._4_4_];
    }
  }
  else if (fe->log_spec == '\x02') {
    fe_dct2(fe,mflogspec,mfcep,0);
    fe_dct3(fe,mfcep,mflogspec);
    for (mfspec._4_4_ = 0; mfspec._4_4_ < (int)(uint)fe->feature_dimension;
        mfspec._4_4_ = mfspec._4_4_ + 1) {
      mfcep[mfspec._4_4_] = (mfcc_t)(float)(double)mflogspec[mfspec._4_4_];
    }
  }
  else if (fe->transform == '\x01') {
    fe_dct2(fe,mflogspec,mfcep,0);
  }
  else if (fe->transform == '\x02') {
    fe_dct2(fe,mflogspec,mfcep,1);
  }
  else {
    fe_spec2cep(fe,mflogspec,mfcep);
  }
  return;
}

Assistant:

static void
fe_mel_cep(fe_t * fe, mfcc_t * mfcep)
{
    int32 i;
    powspec_t *mfspec;

    /* Convenience pointer. */
    mfspec = fe->mfspec;

    for (i = 0; i < fe->mel_fb->num_filters; ++i) {
#ifndef FIXED_POINT             /* It's already in log domain for fixed point */
        mfspec[i] = log(mfspec[i] + LOG_FLOOR);
#endif                          /* !FIXED_POINT */
    }

    /* If we are doing LOG_SPEC, then do nothing. */
    if (fe->log_spec == RAW_LOG_SPEC) {
        for (i = 0; i < fe->feature_dimension; i++) {
            mfcep[i] = (mfcc_t) mfspec[i];
        }
    }
    /* For smoothed spectrum, do DCT-II followed by (its inverse) DCT-III */
    else if (fe->log_spec == SMOOTH_LOG_SPEC) {
        /* FIXME: This is probably broken for fixed-point. */
        fe_dct2(fe, mfspec, mfcep, 0);
        fe_dct3(fe, mfcep, mfspec);
        for (i = 0; i < fe->feature_dimension; i++) {
            mfcep[i] = (mfcc_t) mfspec[i];
        }
    }
    else if (fe->transform == DCT_II)
        fe_dct2(fe, mfspec, mfcep, FALSE);
    else if (fe->transform == DCT_HTK)
        fe_dct2(fe, mfspec, mfcep, TRUE);
    else
        fe_spec2cep(fe, mfspec, mfcep);

    return;
}